

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O1

ENetPeer *
enet_host_connect(ENetHost *host,ENetAddress *address,size_t channelCount,enet_uint32 data)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  enet_uint32 eVar5;
  size_t sVar6;
  ENetPeer *pEVar7;
  ENetChannel *pEVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  ENetPeer *unaff_R14;
  ENetProtocol command;
  ENetProtocol local_62;
  
  sVar6 = 0xff;
  if (channelCount < 0xff) {
    sVar6 = channelCount;
  }
  sVar11 = 1;
  if (channelCount != 0) {
    sVar11 = sVar6;
  }
  uVar2 = host->peerCount;
  bVar3 = uVar2 != 0;
  if (uVar2 == 0) {
    uVar10 = 0;
  }
  else {
    unaff_R14 = *host->peer_list;
    if (unaff_R14->state == ENET_PEER_STATE_DISCONNECTED) {
      uVar10 = 0;
    }
    else {
      uVar4 = 1;
      do {
        uVar9 = uVar4;
        uVar10 = uVar2;
        if (uVar2 == uVar9) break;
        unaff_R14 = host->peer_list[uVar9];
        uVar10 = uVar9;
        uVar4 = uVar9 + 1;
      } while (unaff_R14->state != ENET_PEER_STATE_DISCONNECTED);
      bVar3 = uVar9 < uVar2;
    }
  }
  if (!bVar3) {
    if (0xfffffe < (uint)uVar10) {
      return (ENetPeer *)0x0;
    }
    host->peerCount = uVar2 + 1;
    pEVar7 = (ENetPeer *)enet_malloc(0x1d8);
    host->peer_list[uVar10] = pEVar7;
    memset(host->peer_list[uVar10],0,0x1d8);
    unaff_R14 = host->peer_list[uVar10];
    unaff_R14->host = host;
    unaff_R14->incomingPeerID = (uint)uVar10;
    unaff_R14->outgoingSessionID = 0xff;
    unaff_R14->incomingSessionID = 0xff;
    unaff_R14->data = (void *)0x0;
    enet_list_clear(&unaff_R14->acknowledgements);
    enet_list_clear(&unaff_R14->sentReliableCommands);
    enet_list_clear(&unaff_R14->sentUnreliableCommands);
    enet_list_clear(&unaff_R14->outgoingReliableCommands);
    enet_list_clear(&unaff_R14->outgoingUnreliableCommands);
    enet_list_clear(&unaff_R14->dispatchedCommands);
    enet_peer_reset(unaff_R14);
  }
  pEVar8 = (ENetChannel *)enet_malloc(sVar11 * 0x50);
  unaff_R14->channels = pEVar8;
  if (pEVar8 == (ENetChannel *)0x0) {
    return (ENetPeer *)0x0;
  }
  unaff_R14->channelCount = sVar11;
  unaff_R14->state = ENET_PEER_STATE_CONNECTING;
  unaff_R14->address = *address;
  eVar5 = host->randomSeed + 1;
  host->randomSeed = eVar5;
  unaff_R14->connectID = eVar5;
  eVar5 = 0x10000;
  uVar1 = host->outgoingBandwidth >> 4 & 0xffff000;
  if (host->outgoingBandwidth == 0) {
    uVar1 = 0x10000;
  }
  unaff_R14->windowSize = uVar1;
  if (uVar1 == 0) {
    eVar5 = 0x1000;
  }
  else if (uVar1 < 0x10001) goto LAB_00103ba7;
  unaff_R14->windowSize = eVar5;
LAB_00103ba7:
  if (sVar11 != 0) {
    pEVar8 = unaff_R14->channels;
    do {
      pEVar8->outgoingReliableSequenceNumber = 0;
      pEVar8->outgoingUnreliableSequenceNumber = 0;
      pEVar8->incomingReliableSequenceNumber = 0;
      pEVar8->incomingUnreliableSequenceNumber = 0;
      enet_list_clear(&pEVar8->incomingReliableCommands);
      enet_list_clear(&pEVar8->incomingUnreliableCommands);
      pEVar8->reliableWindows[7] = 0;
      pEVar8->reliableWindows[8] = 0;
      pEVar8->reliableWindows[9] = 0;
      pEVar8->reliableWindows[10] = 0;
      pEVar8->reliableWindows[0xb] = 0;
      pEVar8->reliableWindows[0xc] = 0;
      pEVar8->reliableWindows[0xd] = 0;
      pEVar8->reliableWindows[0xe] = 0;
      pEVar8->usedReliableWindows = 0;
      pEVar8->reliableWindows[0] = 0;
      pEVar8->reliableWindows[1] = 0;
      pEVar8->reliableWindows[2] = 0;
      pEVar8->reliableWindows[3] = 0;
      pEVar8->reliableWindows[4] = 0;
      pEVar8->reliableWindows[5] = 0;
      pEVar8->reliableWindows[6] = 0;
      pEVar8->reliableWindows[0xf] = 0;
      pEVar8 = pEVar8 + 1;
    } while (pEVar8 < unaff_R14->channels + sVar11);
  }
  local_62._0_2_ = 0xff82;
  uVar1 = unaff_R14->incomingPeerID;
  local_62.connect.outgoingPeerID =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  local_62.connect.incomingSessionID = unaff_R14->incomingSessionID;
  local_62.connect.outgoingSessionID = unaff_R14->outgoingSessionID;
  uVar1 = unaff_R14->mtu;
  local_62.connect.mtu =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = unaff_R14->windowSize;
  local_62.connect.windowSize =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  local_62.connect.channelCount = (int)sVar11 << 0x18;
  uVar1 = host->incomingBandwidth;
  local_62.connect.incomingBandwidth =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = host->outgoingBandwidth;
  local_62.connect.outgoingBandwidth =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = unaff_R14->packetThrottleInterval;
  local_62.connect.packetThrottleInterval =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = unaff_R14->packetThrottleAcceleration;
  local_62.connect.packetThrottleAcceleration =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = unaff_R14->packetThrottleDeceleration;
  local_62.connect.packetThrottleDeceleration =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  local_62.connect.connectID = unaff_R14->connectID;
  local_62.connect.data =
       data >> 0x18 | (data & 0xff0000) >> 8 | (data & 0xff00) << 8 | data << 0x18;
  enet_peer_queue_outgoing_command(unaff_R14,&local_62,(ENetPacket *)0x0,0,0);
  return unaff_R14;
}

Assistant:

ENetPeer *
enet_host_connect (ENetHost * host, const ENetAddress * address, size_t channelCount, enet_uint32 data)
{
    ENetPeer * currentPeer;
    ENetChannel * channel;
    ENetProtocol command;
    int i;

    if (channelCount < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT)
      channelCount = ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT;
    else
    if (channelCount > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
      channelCount = ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT;

    for (i = 0; i < host -> peerCount; i++ )
    {
       currentPeer = host -> peer_list[i];

       if (currentPeer -> state == ENET_PEER_STATE_DISCONNECTED)
         break;
    }

    if (i >= host -> peerCount)
    {
	if (i >= ENET_PROTOCOL_MAXIMUM_PEER_ID) 
	    return NULL;
	host -> peerCount++;
	host -> peer_list[i] = enet_malloc (sizeof (ENetPeer));
	memset (host -> peer_list[i], 0, sizeof (ENetPeer));
	currentPeer = host->peer_list[i];
	currentPeer -> host = host;
	currentPeer -> incomingPeerID = i;
	currentPeer -> outgoingSessionID = currentPeer -> incomingSessionID = 0xFF;
	currentPeer -> data = NULL;

	enet_list_clear (& currentPeer -> acknowledgements);
	enet_list_clear (& currentPeer -> sentReliableCommands);
	enet_list_clear (& currentPeer -> sentUnreliableCommands);
	enet_list_clear (& currentPeer -> outgoingReliableCommands);
	enet_list_clear (& currentPeer -> outgoingUnreliableCommands);
	enet_list_clear (& currentPeer -> dispatchedCommands);

	enet_peer_reset (currentPeer);
    }

    currentPeer -> channels = (ENetChannel *) enet_malloc (channelCount * sizeof (ENetChannel));
    if (currentPeer -> channels == NULL)
      return NULL;
    currentPeer -> channelCount = channelCount;
    currentPeer -> state = ENET_PEER_STATE_CONNECTING;
    currentPeer -> address = * address;
    currentPeer -> connectID = ++ host -> randomSeed;

    if (host -> outgoingBandwidth == 0)
      currentPeer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
    else
      currentPeer -> windowSize = (host -> outgoingBandwidth /
                                    ENET_PEER_WINDOW_SIZE_SCALE) * 
                                      ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;

    if (currentPeer -> windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE)
      currentPeer -> windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
    else
    if (currentPeer -> windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE)
      currentPeer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
         
    for (channel = currentPeer -> channels;
         channel < & currentPeer -> channels [channelCount];
         ++ channel)
    {
        channel -> outgoingReliableSequenceNumber = 0;
        channel -> outgoingUnreliableSequenceNumber = 0;
        channel -> incomingReliableSequenceNumber = 0;
        channel -> incomingUnreliableSequenceNumber = 0;

        enet_list_clear (& channel -> incomingReliableCommands);
        enet_list_clear (& channel -> incomingUnreliableCommands);

        channel -> usedReliableWindows = 0;
        memset (channel -> reliableWindows, 0, sizeof (channel -> reliableWindows));
    }
        
    command.header.command = ENET_PROTOCOL_COMMAND_CONNECT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
    command.header.channelID = 0xFF;
    command.connect.outgoingPeerID = ENET_HOST_TO_NET_32 (currentPeer -> incomingPeerID);
    command.connect.incomingSessionID = currentPeer -> incomingSessionID;
    command.connect.outgoingSessionID = currentPeer -> outgoingSessionID;
    command.connect.mtu = ENET_HOST_TO_NET_32 (currentPeer -> mtu);
    command.connect.windowSize = ENET_HOST_TO_NET_32 (currentPeer -> windowSize);
    command.connect.channelCount = ENET_HOST_TO_NET_32 (channelCount);
    command.connect.incomingBandwidth = ENET_HOST_TO_NET_32 (host -> incomingBandwidth);
    command.connect.outgoingBandwidth = ENET_HOST_TO_NET_32 (host -> outgoingBandwidth);
    command.connect.packetThrottleInterval = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleInterval);
    command.connect.packetThrottleAcceleration = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleAcceleration);
    command.connect.packetThrottleDeceleration = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleDeceleration);
    command.connect.connectID = currentPeer -> connectID;
    command.connect.data = ENET_HOST_TO_NET_32 (data);
 
    enet_peer_queue_outgoing_command (currentPeer, & command, NULL, 0, 0);

    return currentPeer;
}